

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

Option * __thiscall CLI::Option::multi_option_policy(Option *this,MultiOptionPolicy value)

{
  int iVar1;
  IncorrectConstruction *__return_storage_ptr__;
  string local_38;
  MultiOptionPolicy local_14;
  Option *pOStack_10;
  MultiOptionPolicy value_local;
  Option *this_local;
  
  local_14 = value;
  pOStack_10 = this;
  iVar1 = get_expected(this);
  if (iVar1 != 0) {
    iVar1 = get_expected(this);
    if (iVar1 != 1) {
      __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      single_name_abi_cxx11_(&local_38,this);
      IncorrectConstruction::MultiOptionPolicy(__return_storage_ptr__,&local_38);
      __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,
                  IncorrectConstruction::~IncorrectConstruction);
    }
  }
  (this->super_OptionBase<CLI::Option>).multi_option_policy_ = local_14;
  return this;
}

Assistant:

Option *multi_option_policy(MultiOptionPolicy value = MultiOptionPolicy::Throw) {
        if(get_expected() != 0 && get_expected() != 1)
            throw IncorrectConstruction::MultiOptionPolicy(single_name());
        multi_option_policy_ = value;
        return this;
    }